

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O3

int bip32_key_to_base58(ext_key *hdkey,uint32_t flags,char **output)

{
  int iVar1;
  uchar bytes [78];
  uchar auStack_68 [80];
  
  iVar1 = bip32_key_serialize(hdkey,flags,auStack_68,0x4e);
  if (iVar1 == 0) {
    iVar1 = wally_base58_from_bytes(auStack_68,0x4e,1,output);
    wally_clear(auStack_68,0x4e);
  }
  return iVar1;
}

Assistant:

int bip32_key_to_base58(const struct ext_key *hdkey,
                        uint32_t flags,
                        char **output)
{
    int ret;
    unsigned char bytes[BIP32_SERIALIZED_LEN];

    if ((ret = bip32_key_serialize(hdkey, flags, bytes, sizeof(bytes))))
        return ret;

    ret = wally_base58_from_bytes(bytes, BIP32_SERIALIZED_LEN, BASE58_FLAG_CHECKSUM, output);

    wally_clear(bytes, sizeof(bytes));
    return ret;
}